

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

int rtr_bgpsec_append_sig_seg(rtr_bgpsec *bgpsec,rtr_signature_seg *new_seg)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  rtr_signature_seg *local_30;
  rtr_signature_seg *last;
  rtr_signature_seg *new_seg_local;
  rtr_bgpsec *bgpsec_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = bgpsec->sigs;
  if ((((new_seg == (rtr_signature_seg *)0x0) || (new_seg->signature == (uint8_t *)0x0)) ||
      (new_seg->sig_len == 0)) || (iVar2 = ski_is_empty(new_seg->ski), iVar2 != 0)) {
    bgpsec_local._4_4_ = -1;
  }
  else {
    if (bgpsec->sigs == (rtr_signature_seg *)0x0) {
      bgpsec->sigs = new_seg;
    }
    else {
      for (; local_30->next != (rtr_signature_seg *)0x0; local_30 = local_30->next) {
      }
      local_30->next = new_seg;
    }
    bgpsec->sigs_len = bgpsec->sigs_len + 1;
    bgpsec_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bgpsec_local._4_4_;
}

Assistant:

int rtr_bgpsec_append_sig_seg(struct rtr_bgpsec *bgpsec, struct rtr_signature_seg *new_seg)
{
	struct rtr_signature_seg *last = bgpsec->sigs;

	if (!new_seg || !new_seg->signature || !new_seg->sig_len || ski_is_empty(new_seg->ski))
		return RTR_BGPSEC_ERROR;

	if (bgpsec->sigs) {
		while (last->next)
			last = last->next;
		last->next = new_seg;
	} else {
		bgpsec->sigs = new_seg;
	}

	bgpsec->sigs_len++;

	return RTR_BGPSEC_SUCCESS;
}